

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O1

RECORD_TYPE ON_HistoryRecord::RecordType(int i)

{
  return (RECORD_TYPE)(i == 1);
}

Assistant:

ON_HistoryRecord::RECORD_TYPE ON_HistoryRecord::RecordType(int i)
{
  switch (i)
  {
  case (int)ON_HistoryRecord::RECORD_TYPE::history_parameters:
    return ON_HistoryRecord::RECORD_TYPE::history_parameters;

  case (int)ON_HistoryRecord::RECORD_TYPE::feature_parameters:
    return ON_HistoryRecord::RECORD_TYPE::feature_parameters;
  }

  return ON_HistoryRecord::RECORD_TYPE::history_parameters;
}